

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

CService * __thiscall CNode::GetAddrLocal(CService *__return_storage_ptr__,CNode *this)

{
  uint32_t uVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock30;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->m_addr_local_mutex).super_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->m_addr_local);
  uVar1 = (this->m_addr_local).super_CNetAddr.m_scope_id;
  (__return_storage_ptr__->super_CNetAddr).m_net = (this->m_addr_local).super_CNetAddr.m_net;
  (__return_storage_ptr__->super_CNetAddr).m_scope_id = uVar1;
  __return_storage_ptr__->port = (this->m_addr_local).port;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CService CNode::GetAddrLocal() const
{
    AssertLockNotHeld(m_addr_local_mutex);
    LOCK(m_addr_local_mutex);
    return m_addr_local;
}